

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::Var> __thiscall
kratos::PackedSlice::slice_var(PackedSlice *this,shared_ptr<kratos::Var> *var)

{
  VarType VVar1;
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<kratos::Var> sVar3;
  undefined1 local_50 [8];
  shared_ptr<kratos::VarPackedStruct> v_1;
  undefined1 local_30 [8];
  shared_ptr<kratos::PortPackedStruct> v;
  shared_ptr<kratos::Var> *var_local;
  PackedSlice *this_local;
  
  this_00 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(in_RDX);
  VVar1 = Var::type(this_00);
  if (VVar1 == PortIO) {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_RDX);
    Var::as<kratos::PortPackedStruct>((Var *)local_30);
    this_01 = std::
              __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    PortPackedStruct::operator[]
              (this_01,(string *)
                       var[0x29].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    std::enable_shared_from_this<kratos::Var>::shared_from_this
              ((enable_shared_from_this<kratos::Var> *)this);
    std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
              ((shared_ptr<kratos::PortPackedStruct> *)local_30);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_RDX);
    Var::as<kratos::VarPackedStruct>((Var *)local_50);
    this_02 = std::
              __shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_50);
    VarPackedStruct::operator[]
              (this_02,(string *)
                       var[0x29].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    std::enable_shared_from_this<kratos::Var>::shared_from_this
              ((enable_shared_from_this<kratos::Var> *)this);
    std::shared_ptr<kratos::VarPackedStruct>::~shared_ptr
              ((shared_ptr<kratos::VarPackedStruct> *)local_50);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar3.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Var> PackedSlice::slice_var(std::shared_ptr<Var> var) {
    if (var->type() == VarType::PortIO) {
        auto v = var->as<PortPackedStruct>();
        return v->operator[](def_->name).shared_from_this();
    } else {
        auto v = var->as<VarPackedStruct>();
        return v->operator[](def_->name).shared_from_this();
    }
}